

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O3

void __thiscall
slang::analysis::DataFlowAnalysis::joinState
          (DataFlowAnalysis *this,DataFlowState *result,DataFlowState *other)

{
  unsigned_long *puVar1;
  ulong newSize;
  pointer pIVar2;
  undefined4 uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 local_d0 [24];
  IntervalMap<unsigned_long,_std::monostate,_3U> aIStack_b8 [2];
  bool local_38;
  
  if (result->reachable == other->reachable) {
    uVar4 = (result->assigned).
            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len;
    newSize = (other->assigned).
              super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len;
    if (newSize < uVar4) {
      SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
      resizeImpl<slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::ValueInitTag>
                ((SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *)result,
                 newSize,(ValueInitTag *)local_d0);
      uVar4 = (result->assigned).
              super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len;
    }
    if (uVar4 != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        IntervalMap<unsigned_long,_std::monostate,_3U>::intersection
                  ((IntervalMap<unsigned_long,_std::monostate,_3U> *)local_d0,
                   (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                   ((long)&((result->assigned).
                            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                           .data_)->field_0 + lVar5),
                   (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                   ((long)&((other->assigned).
                            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                           .data_)->field_0 + lVar5),&this->bitMapAllocator);
        uVar3 = aIStack_b8[0].field_0.rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                .first[2].left._4_4_;
        pIVar2 = (result->assigned).
                 super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_
        ;
        puVar1 = (unsigned_long *)((long)&pIVar2->field_0 + lVar5);
        *(undefined4 *)((long)&pIVar2->height + lVar5) =
             (undefined4)
             aIStack_b8[0].field_0.rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[2].left;
        aIStack_b8[0].field_0.rootLeaf.
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first
        [2].left._4_4_ = 0;
        *(undefined4 *)((long)&pIVar2->rootSize + lVar5) = uVar3;
        if ((undefined4)
            aIStack_b8[0].field_0.rootLeaf.
            super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
            first[2].left == 0) {
          puVar1[6] = aIStack_b8[0].field_0._24_8_;
        }
        puVar1[4] = aIStack_b8[0].field_0.rootLeaf.
                    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                    .first[0].right;
        puVar1[5] = aIStack_b8[0].field_0.rootLeaf.
                    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                    .first[1].left;
        puVar1[2] = local_d0._16_8_;
        puVar1[3] = aIStack_b8[0].field_0.rootLeaf.
                    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                    .first[0].left;
        *puVar1 = local_d0._0_8_;
        puVar1[1] = local_d0._8_8_;
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x40;
      } while (uVar4 < (result->assigned).
                       super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                       .len);
    }
  }
  else if (result->reachable == false) {
    copyState((DataFlowState *)local_d0,this,other);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator=
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)result,
               (SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)local_d0);
    result->reachable = local_38;
    if ((IntervalMap<unsigned_long,_std::monostate,_3U> *)local_d0._0_8_ != aIStack_b8) {
      operator_delete((void *)local_d0._0_8_);
    }
  }
  return;
}

Assistant:

void DataFlowAnalysis::joinState(DataFlowState& result, const DataFlowState& other) {
    if (result.reachable == other.reachable) {
        if (result.assigned.size() > other.assigned.size())
            result.assigned.resize(other.assigned.size());

        for (size_t i = 0; i < result.assigned.size(); i++) {
            result.assigned[i] = result.assigned[i].intersection(other.assigned[i],
                                                                 bitMapAllocator);
        }
    }
    else if (!result.reachable) {
        result = copyState(other);
    }
}